

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

GenericVec4
deqp::gles31::Functional::anon_unknown_1::mapToFormatColorUnits
          (TextureFormat *texFormat,Vec4 *normalizedRange)

{
  undefined1 auVar1 [16];
  TextureChannelClass TVar2;
  undefined1 auVar3 [16];
  anon_union_16_3_1194ccdc_for_v aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  TextureFormatInfo texFormatInfo;
  TextureFormatInfo local_58;
  
  tcu::getTextureFormatInfo(&local_58,texFormat);
  TVar2 = tcu::getTextureChannelClass(texFormat->type);
  switch(TVar2) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
    aVar4._0_4_ = normalizedRange->m_data[0] + normalizedRange->m_data[0] + -1.0;
    aVar4._4_4_ = normalizedRange->m_data[1] + normalizedRange->m_data[1] + -1.0;
    aVar4._8_4_ = normalizedRange->m_data[2] + normalizedRange->m_data[2] + -1.0;
    aVar4._12_4_ = normalizedRange->m_data[3] + normalizedRange->m_data[3] + -1.0;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
    aVar4 = *(anon_union_16_3_1194ccdc_for_v *)normalizedRange->m_data;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    aVar4._0_4_ = (float)(int)((1.0 - normalizedRange->m_data[0]) * local_58.valueMin.m_data[0] +
                              normalizedRange->m_data[0] * local_58.valueMax.m_data[0]);
    aVar4._4_4_ = (float)(int)((1.0 - normalizedRange->m_data[1]) * local_58.valueMin.m_data[1] +
                              normalizedRange->m_data[1] * local_58.valueMax.m_data[1]);
    aVar4._8_4_ = (float)(int)((1.0 - normalizedRange->m_data[2]) * local_58.valueMin.m_data[2] +
                              normalizedRange->m_data[2] * local_58.valueMax.m_data[2]);
    aVar4._12_4_ = (float)(int)((1.0 - normalizedRange->m_data[3]) * local_58.valueMin.m_data[3] +
                               normalizedRange->m_data[3] * local_58.valueMax.m_data[3]);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    fVar5 = (1.0 - normalizedRange->m_data[0]) * local_58.valueMin.m_data[0] +
            normalizedRange->m_data[0] * local_58.valueMax.m_data[0];
    fVar6 = (1.0 - normalizedRange->m_data[1]) * local_58.valueMin.m_data[1] +
            normalizedRange->m_data[1] * local_58.valueMax.m_data[1];
    fVar7 = (1.0 - normalizedRange->m_data[2]) * local_58.valueMin.m_data[2] +
            normalizedRange->m_data[2] * local_58.valueMax.m_data[2];
    fVar8 = (1.0 - normalizedRange->m_data[3]) * local_58.valueMin.m_data[3] +
            normalizedRange->m_data[3] * local_58.valueMax.m_data[3];
    iVar9 = (int)fVar5;
    iVar10 = (int)fVar6;
    iVar11 = (int)fVar7;
    iVar12 = (int)fVar8;
    auVar13._0_4_ = iVar9 >> 0x1f;
    auVar13._4_4_ = iVar10 >> 0x1f;
    auVar13._8_4_ = iVar11 >> 0x1f;
    auVar13._12_4_ = iVar12 >> 0x1f;
    auVar3._0_4_ = (int)(fVar5 - 2.1474836e+09);
    auVar3._4_4_ = (int)(fVar6 - 2.1474836e+09);
    auVar3._8_4_ = (int)(fVar7 - 2.1474836e+09);
    auVar3._12_4_ = (int)(fVar8 - 2.1474836e+09);
    auVar1._4_4_ = iVar10;
    auVar1._0_4_ = iVar9;
    auVar1._8_4_ = iVar11;
    auVar1._12_4_ = iVar12;
    aVar4 = (anon_union_16_3_1194ccdc_for_v)(auVar3 & auVar13 | auVar1);
    break;
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    aVar4._0_4_ = normalizedRange->m_data[0] * local_58.valueMax.m_data[0] +
                  local_58.valueMin.m_data[0];
    aVar4._4_4_ = normalizedRange->m_data[1] * local_58.valueMax.m_data[1] +
                  local_58.valueMin.m_data[1];
    aVar4._8_4_ = normalizedRange->m_data[2] * local_58.valueMax.m_data[2] +
                  local_58.valueMin.m_data[2];
    aVar4._12_4_ = normalizedRange->m_data[3] * local_58.valueMax.m_data[3] +
                   local_58.valueMin.m_data[3];
    break;
  default:
    aVar4 = (anon_union_16_3_1194ccdc_for_v)0x0;
  }
  return (GenericVec4)aVar4;
}

Assistant:

rr::GenericVec4 mapToFormatColorUnits (const tcu::TextureFormat& texFormat, const tcu::Vec4& normalizedRange)
{
	const tcu::TextureFormatInfo texFormatInfo = tcu::getTextureFormatInfo(texFormat);

	switch (tcu::getTextureChannelClass(texFormat.type))
	{
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange);
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:		return rr::GenericVec4(normalizedRange * 2.0f - 1.0f);
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:			return rr::GenericVec4(texFormatInfo.valueMin + normalizedRange * texFormatInfo.valueMax);
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deInt32>());
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:			return rr::GenericVec4(tcu::mix(texFormatInfo.valueMin, texFormatInfo.valueMax, normalizedRange).cast<deUint32>());

		default:
			DE_ASSERT(false);
			return rr::GenericVec4();
	}
}